

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::detail::IEEEFloat::roundToIntegral(IEEEFloat *this,roundingMode rounding_mode)

{
  opStatus oVar1;
  uint uVar2;
  byte bVar3;
  APInt IntegerConstant;
  IEEEFloat MagicConstant;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  IEEEFloat local_40;
  
  if (((this->field_0x12 & 7) == 3 || (this->field_0x12 & 6) == 0) ||
     (oVar1 = opOK, this->exponent + 1 < (int)this->semantics->precision)) {
    uVar2 = this->semantics->precision;
    uVar2 = uVar2 >> 1 | uVar2;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    APInt::APInt((APInt *)&local_50,(uVar2 >> 0x10 | uVar2) + 1,1,false);
    APInt::operator<<=((APInt *)&local_50,this->semantics->precision - 1);
    IEEEFloat(&local_40,this->semantics);
    oVar1 = convertFromAPInt(&local_40,(APInt *)&local_50,false,rmNearestTiesToEven);
    bVar3 = this->field_0x12 & 8;
    local_40._18_1_ = local_40._18_1_ & 0xf7 | bVar3;
    if (oVar1 == opOK) {
      oVar1 = addOrSubtract(this,&local_40,rounding_mode,false);
      if ((oVar1 & (opUnderflow|opOverflow|opDivByZero|opInvalidOp)) == opOK) {
        oVar1 = addOrSubtract(this,&local_40,rounding_mode,true);
        if ((bVar3 != 0) != (bool)((this->field_0x12 & 8) >> 3)) {
          this->field_0x12 = this->field_0x12 ^ 8;
        }
      }
    }
    ~IEEEFloat(&local_40);
    if ((0x40 < local_48) && ((void *)local_50.VAL != (void *)0x0)) {
      operator_delete__(local_50.pVal);
    }
  }
  return oVar1;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::roundToIntegral(roundingMode rounding_mode) {
  opStatus fs;

  // If the exponent is large enough, we know that this value is already
  // integral, and the arithmetic below would potentially cause it to saturate
  // to +/-Inf.  Bail out early instead.
  if (isFiniteNonZero() && exponent+1 >= (int)semanticsPrecision(*semantics))
    return opOK;

  // The algorithm here is quite simple: we add 2^(p-1), where p is the
  // precision of our format, and then subtract it back off again.  The choice
  // of rounding modes for the addition/subtraction determines the rounding mode
  // for our integral rounding as well.
  // NOTE: When the input value is negative, we do subtraction followed by
  // addition instead.
  APInt IntegerConstant(NextPowerOf2(semanticsPrecision(*semantics)), 1);
  IntegerConstant <<= semanticsPrecision(*semantics)-1;
  IEEEFloat MagicConstant(*semantics);
  fs = MagicConstant.convertFromAPInt(IntegerConstant, false,
                                      rmNearestTiesToEven);
  MagicConstant.sign = sign;

  if (fs != opOK)
    return fs;

  // Preserve the input sign so that we can handle 0.0/-0.0 cases correctly.
  bool inputSign = isNegative();

  fs = add(MagicConstant, rounding_mode);
  if (fs != opOK && fs != opInexact)
    return fs;

  fs = subtract(MagicConstant, rounding_mode);

  // Restore the input sign.
  if (inputSign != isNegative())
    changeSign();

  return fs;
}